

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprListSetSortOrder(ExprList *p,int iSortOrder,int eNulls)

{
  undefined1 *puVar1;
  anon_struct_4_9_b482b7ef_for_fg *paVar2;
  int iVar3;
  int iVar4;
  
  if (p != (ExprList *)0x0) {
    iVar3 = p->nExpr;
    iVar4 = 0;
    if (iSortOrder != -1) {
      iVar4 = iSortOrder;
    }
    p->a[(long)iVar3 + -1].fg.sortFlags = (byte)iVar4;
    if (eNulls != -1) {
      paVar2 = &p->a[(long)iVar3 + -1].fg;
      puVar1 = &paVar2->field_0x1;
      *puVar1 = *puVar1 | 0x20;
      if (iVar4 != eNulls) {
        paVar2->sortFlags = (byte)iVar4 | 2;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListSetSortOrder(ExprList *p, int iSortOrder, int eNulls){
  struct ExprList_item *pItem;
  if( p==0 ) return;
  assert( p->nExpr>0 );

  assert( SQLITE_SO_UNDEFINED<0 && SQLITE_SO_ASC==0 && SQLITE_SO_DESC>0 );
  assert( iSortOrder==SQLITE_SO_UNDEFINED
       || iSortOrder==SQLITE_SO_ASC
       || iSortOrder==SQLITE_SO_DESC
  );
  assert( eNulls==SQLITE_SO_UNDEFINED
       || eNulls==SQLITE_SO_ASC
       || eNulls==SQLITE_SO_DESC
  );

  pItem = &p->a[p->nExpr-1];
  assert( pItem->fg.bNulls==0 );
  if( iSortOrder==SQLITE_SO_UNDEFINED ){
    iSortOrder = SQLITE_SO_ASC;
  }
  pItem->fg.sortFlags = (u8)iSortOrder;

  if( eNulls!=SQLITE_SO_UNDEFINED ){
    pItem->fg.bNulls = 1;
    if( iSortOrder!=eNulls ){
      pItem->fg.sortFlags |= KEYINFO_ORDER_BIGNULL;
    }
  }
}